

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O2

void Sbc_ManAddInternalToPath(Gia_Man_t *p,Vec_Bit_t *vPath)

{
  int iVar1;
  int *piVar2;
  int iObj;
  int Id;
  long lVar3;
  
  for (Id = 1; Id < p->nObjs; Id = Id + 1) {
    iVar1 = Gia_ObjIsLut(p,Id);
    if (iVar1 != 0) {
      iVar1 = Vec_BitEntry(vPath,Id);
      if (iVar1 != 0) {
        Gia_ManIncrementTravId(p);
        lVar3 = 0;
        while( true ) {
          iVar1 = Gia_ObjLutSize(p,Id);
          if (iVar1 <= lVar3) break;
          piVar2 = Gia_ObjLutFanins(p,Id);
          Gia_ObjSetTravIdCurrentId(p,piVar2[lVar3]);
          lVar3 = lVar3 + 1;
        }
        Sbc_ManAddInternalToPath_rec(p,Id,vPath);
      }
    }
  }
  return;
}

Assistant:

void Sbc_ManAddInternalToPath( Gia_Man_t * p, Vec_Bit_t * vPath )
{
    int k, iFan, iObj;
    Gia_ManForEachLut( p, iObj )
    {
        if ( !Vec_BitEntry(vPath, iObj) )
            continue;
        Gia_ManIncrementTravId( p );
        Gia_LutForEachFanin( p, iObj, iFan, k )
            Gia_ObjSetTravIdCurrentId(p, iFan);
        Sbc_ManAddInternalToPath_rec( p, iObj, vPath );
    }
}